

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

int Fax4PostEncode(TIFF *tif)

{
  undefined4 uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  Fax3CodecState *sp;
  TIFF *tif_local;
  
  puVar2 = tif->tif_data;
  Fax3PutBits(tif,1,0xc);
  Fax3PutBits(tif,1,0xc);
  if (*(int *)(puVar2 + 0x4c) != 8) {
    if ((tif->tif_rawdatasize <= tif->tif_rawcc) && (iVar4 = TIFFFlushData1(tif), iVar4 == 0)) {
      return 0;
    }
    uVar1 = *(undefined4 *)(puVar2 + 0x48);
    puVar3 = tif->tif_rawcp;
    tif->tif_rawcp = puVar3 + 1;
    *puVar3 = (uint8_t)uVar1;
    tif->tif_rawcc = tif->tif_rawcc + 1;
    puVar2[0x48] = '\0';
    puVar2[0x49] = '\0';
    puVar2[0x4a] = '\0';
    puVar2[0x4b] = '\0';
    puVar2[0x4c] = '\b';
    puVar2[0x4d] = '\0';
    puVar2[0x4e] = '\0';
    puVar2[0x4f] = '\0';
  }
  return 1;
}

Assistant:

static int Fax4PostEncode(TIFF *tif)
{
    Fax3CodecState *sp = EncoderState(tif);

    /* terminate strip w/ EOFB */
    Fax3PutBits(tif, EOL, 12);
    Fax3PutBits(tif, EOL, 12);
    if (sp->bit != 8)
        Fax3FlushBits(tif, sp);
    return (1);
}